

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# viewer_device.cpp
# Opt level: O0

uint embree::postIntersect(TutorialData *data,Ray *ray,DifferentialGeometry *dg)

{
  float fVar1;
  uint uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  ISPCInstance *pIVar7;
  long lVar8;
  long in_RDX;
  long in_RSI;
  long *in_RDI;
  uint materialID;
  ISPCGeometry *mesh;
  ISPCInstanceArray *instanceArray;
  ISPCInstance *instance;
  uint instID;
  int i;
  ISPCGeometry **geometries;
  AffineSpace3fa local2world;
  float local_28e8;
  float local_28e4;
  float local_28e0;
  float local_28d8;
  float local_28d4;
  float local_28d0;
  float local_28c8;
  float local_28c4;
  float local_28c0;
  float local_28b8;
  float local_28b4;
  float local_28b0;
  undefined8 local_28a8;
  undefined8 uStackY_28a0;
  undefined8 local_2898;
  undefined8 uStackY_2890;
  undefined8 local_2888;
  undefined8 uStackY_2880;
  long local_2878;
  ISPCInstance *pIStackY_2870;
  long local_2860;
  float local_2858;
  float local_2854;
  float local_2850;
  float local_2848;
  float local_2844;
  float local_2840;
  float local_2838;
  float local_2834;
  float local_2830;
  float local_2828;
  float local_2824;
  float local_2820;
  undefined8 local_2818;
  undefined8 uStackY_2810;
  undefined8 local_2808;
  undefined8 uStackY_2800;
  undefined8 local_27f8;
  undefined8 uStackY_27f0;
  undefined1 local_27e8 [4];
  uint in_stack_ffffffffffffd81c;
  ISPCInstance *in_stack_ffffffffffffd820;
  float in_stack_ffffffffffffd828;
  uint in_stack_ffffffffffffd82c;
  ISPCInstanceArray *in_stack_ffffffffffffd830;
  int local_27c4;
  RTCGeometry local_27c0;
  undefined8 local_27b8;
  undefined8 uStack_27b0;
  undefined8 local_27a8;
  undefined8 uStack_27a0;
  undefined8 local_2798;
  undefined8 uStack_2790;
  undefined8 local_2788;
  undefined8 uStack_2780;
  long local_2778;
  ISPCInstance *pIStack_2770;
  long local_2760;
  long local_2758;
  undefined8 local_2748;
  undefined8 uStack_2740;
  undefined8 local_2738;
  undefined8 uStack_2730;
  undefined8 local_2728;
  undefined8 uStack_2720;
  undefined8 *local_2718;
  undefined8 *local_2710;
  undefined4 local_2704;
  undefined8 *local_2700;
  undefined8 local_26f8;
  undefined8 uStack_26f0;
  long local_26e8;
  ISPCInstance *pIStack_26e0;
  undefined8 local_26d8;
  undefined8 uStack_26d0;
  undefined8 local_26c8;
  undefined8 uStack_26c0;
  undefined8 local_26b8;
  undefined8 uStack_26b0;
  float *local_26a0;
  undefined8 *local_2698;
  undefined8 *local_2690;
  undefined8 local_2688;
  undefined8 uStack_2680;
  long local_2678;
  ISPCInstance *pIStack_2670;
  undefined8 local_2668;
  undefined8 uStack_2660;
  undefined8 local_2658;
  undefined8 uStack_2650;
  undefined8 local_2648;
  undefined8 uStack_2640;
  float *local_2630;
  undefined8 *local_2628;
  undefined8 *local_2620;
  long local_2618;
  long local_2610;
  undefined8 *local_2608;
  undefined8 *local_2600;
  undefined8 *local_25f8;
  undefined8 *local_25f0;
  undefined1 *local_25b8;
  long *local_25b0;
  long *local_25a8;
  long *local_25a0;
  long *local_2578;
  undefined8 *local_2570;
  long *local_2568;
  long *local_2560;
  undefined8 *local_2558;
  long *local_2550;
  float local_2548;
  float fStack_2544;
  float fStack_2540;
  float fStack_253c;
  long *local_2530;
  float local_2528;
  float fStack_2524;
  float fStack_2520;
  float fStack_251c;
  long *local_2510;
  undefined4 local_2508;
  undefined4 uStack_2504;
  undefined4 uStack_2500;
  undefined4 uStack_24fc;
  undefined4 local_24ec;
  undefined8 local_24e8;
  undefined8 uStack_24e0;
  undefined8 local_24d8;
  undefined8 uStack_24d0;
  undefined8 local_24c8;
  undefined8 uStack_24c0;
  undefined8 local_24b8;
  undefined8 uStack_24b0;
  undefined8 *local_24a8;
  undefined8 *local_24a0;
  undefined8 *local_2498;
  undefined8 *local_2490;
  undefined8 *local_2488;
  undefined8 *local_2480;
  undefined8 *local_2478;
  undefined8 *local_2470;
  undefined8 *local_2468;
  undefined8 *local_2460;
  undefined8 *local_2458;
  undefined8 *local_2450;
  undefined8 *local_2448;
  undefined8 *local_2440;
  undefined8 *local_2438;
  undefined8 *local_2430;
  undefined8 local_2428;
  undefined8 uStack_2420;
  undefined8 local_2418;
  undefined8 uStack_2410;
  undefined8 local_2408;
  undefined8 uStack_2400;
  float *local_23f0;
  undefined8 *local_23e8;
  undefined8 *local_23e0;
  undefined8 local_23d8;
  undefined8 uStack_23d0;
  undefined8 local_23c8;
  undefined8 uStack_23c0;
  undefined8 local_23b8;
  undefined8 uStack_23b0;
  float *local_23a0;
  undefined8 *local_2398;
  undefined8 *local_2390;
  undefined1 local_2388 [16];
  undefined8 local_2378;
  undefined8 uStack_2370;
  undefined1 local_2368 [16];
  undefined8 local_2358;
  undefined8 uStack_2350;
  undefined1 local_2348 [24];
  float *local_2330;
  undefined8 *local_2328;
  undefined8 *local_2320;
  undefined1 *local_2310;
  undefined1 *local_2300;
  undefined1 *local_22f0;
  undefined8 *local_2290;
  undefined1 *local_2288;
  undefined8 *local_2280;
  float local_2278;
  float fStack_2274;
  float fStack_2270;
  float fStack_226c;
  undefined8 *local_2260;
  undefined8 local_2258;
  undefined8 uStack_2250;
  undefined1 local_2238 [16];
  undefined8 local_2228;
  undefined8 uStack_2220;
  undefined1 local_2218 [16];
  undefined8 local_2208;
  undefined8 uStack_2200;
  undefined1 local_21f8 [24];
  float *local_21e0;
  undefined8 *local_21d8;
  undefined8 *local_21d0;
  undefined1 *local_21c0;
  undefined1 *local_21b0;
  undefined1 *local_21a0;
  undefined8 *local_2140;
  undefined1 *local_2138;
  undefined8 *local_2130;
  float local_2128;
  float fStack_2124;
  float fStack_2120;
  float fStack_211c;
  undefined8 *local_2110;
  undefined8 local_2108;
  undefined8 uStack_2100;
  undefined1 local_20e8 [16];
  undefined8 local_20d8;
  undefined8 uStack_20d0;
  undefined1 local_20c8 [16];
  undefined8 local_20b8;
  undefined8 uStack_20b0;
  undefined1 local_20a8 [24];
  float *local_2090;
  undefined8 *local_2088;
  undefined8 *local_2080;
  undefined1 *local_2070;
  undefined1 *local_2060;
  undefined1 *local_2050;
  undefined8 *local_1ff0;
  undefined1 *local_1fe8;
  undefined8 *local_1fe0;
  float local_1fd8;
  float fStack_1fd4;
  float fStack_1fd0;
  float fStack_1fcc;
  undefined8 *local_1fc0;
  undefined8 local_1fb8;
  undefined8 uStack_1fb0;
  undefined1 local_1f98 [16];
  undefined8 local_1f88;
  undefined8 uStack_1f80;
  undefined1 local_1f78 [16];
  undefined8 local_1f68;
  undefined8 uStack_1f60;
  undefined1 local_1f58 [24];
  float *local_1f40;
  undefined8 *local_1f38;
  undefined8 *local_1f30;
  undefined1 *local_1f20;
  undefined1 *local_1f10;
  undefined1 *local_1f00;
  undefined8 *local_1ea0;
  undefined1 *local_1e98;
  undefined8 *local_1e90;
  float local_1e88;
  float fStack_1e84;
  float fStack_1e80;
  float fStack_1e7c;
  undefined8 *local_1e70;
  undefined8 local_1e68;
  undefined8 uStack_1e60;
  undefined1 local_1e48 [16];
  undefined8 local_1e38;
  undefined8 uStack_1e30;
  undefined1 local_1e28 [16];
  undefined8 local_1e18;
  undefined8 uStack_1e10;
  undefined1 local_1e08 [24];
  float *local_1df0;
  undefined8 *local_1de8;
  undefined8 *local_1de0;
  undefined1 *local_1dd0;
  undefined1 *local_1dc0;
  undefined1 *local_1db0;
  undefined8 *local_1d50;
  undefined1 *local_1d48;
  undefined8 *local_1d40;
  float local_1d38;
  float fStack_1d34;
  float fStack_1d30;
  float fStack_1d2c;
  undefined8 *local_1d20;
  undefined8 local_1d18;
  undefined8 uStack_1d10;
  undefined1 local_1cf8 [16];
  undefined8 local_1ce8;
  undefined8 uStack_1ce0;
  undefined1 local_1cd8 [16];
  undefined8 local_1cc8;
  undefined8 uStack_1cc0;
  undefined1 local_1cb8 [24];
  float *local_1ca0;
  undefined8 *local_1c98;
  undefined8 *local_1c90;
  undefined1 *local_1c80;
  undefined1 *local_1c70;
  undefined1 *local_1c60;
  undefined8 *local_1c00;
  undefined1 *local_1bf8;
  undefined8 *local_1bf0;
  float local_1be8;
  float fStack_1be4;
  float fStack_1be0;
  float fStack_1bdc;
  undefined8 *local_1bd0;
  undefined8 local_1bc8;
  undefined8 uStack_1bc0;
  undefined1 local_1ba8 [16];
  undefined8 local_1b98;
  undefined8 uStack_1b90;
  undefined1 local_1b88 [16];
  undefined8 local_1b78;
  undefined8 uStack_1b70;
  undefined1 local_1b68 [24];
  float *local_1b50;
  undefined8 *local_1b48;
  undefined8 *local_1b40;
  undefined1 *local_1b30;
  undefined1 *local_1b20;
  undefined1 *local_1b10;
  undefined8 *local_1ab0;
  undefined1 *local_1aa8;
  undefined8 *local_1aa0;
  float local_1a98;
  float fStack_1a94;
  float fStack_1a90;
  float fStack_1a8c;
  undefined8 *local_1a80;
  undefined8 local_1a78;
  undefined8 uStack_1a70;
  undefined1 local_1a58 [16];
  undefined8 local_1a48;
  undefined8 uStack_1a40;
  undefined1 local_1a38 [16];
  undefined8 local_1a28;
  undefined8 uStack_1a20;
  undefined1 local_1a18 [24];
  float *local_1a00;
  undefined8 *local_19f8;
  undefined8 *local_19f0;
  undefined1 *local_19e0;
  undefined1 *local_19d0;
  undefined1 *local_19c0;
  undefined8 *local_1960;
  undefined1 *local_1958;
  undefined8 *local_1950;
  float local_1948;
  float fStack_1944;
  float fStack_1940;
  float fStack_193c;
  undefined8 *local_1930;
  undefined8 local_1928;
  undefined8 uStack_1920;
  long *local_1908;
  undefined8 *local_1900;
  undefined8 *local_18f8;
  long *local_18f0;
  undefined1 *local_18e8;
  long *local_18e0;
  undefined8 *local_18d8;
  undefined8 *local_18d0;
  long *local_18c8;
  long *local_18c0;
  undefined8 *local_18b8;
  undefined8 *local_18b0;
  undefined8 *local_18a8;
  undefined8 *local_18a0;
  undefined8 *local_1898;
  undefined8 *local_1890;
  undefined8 *local_1888;
  undefined8 *local_1880;
  undefined8 *local_1878;
  undefined8 *local_1870;
  undefined8 *local_1868;
  undefined8 *local_1860;
  undefined8 *local_1858;
  undefined8 *local_1850;
  undefined8 *local_1848;
  undefined8 *local_1840;
  undefined8 *local_1838;
  undefined8 *local_1830;
  undefined8 *local_1828;
  undefined8 *local_1820;
  undefined8 local_1818;
  undefined8 uStack_1810;
  undefined8 *local_1800;
  undefined8 *local_17f8;
  undefined1 *local_17f0;
  undefined8 *local_17e8;
  undefined8 *local_17e0;
  undefined8 *local_17d8;
  undefined8 *local_17d0;
  float local_17c8;
  float fStack_17c4;
  float fStack_17c0;
  float fStack_17bc;
  undefined8 *local_17b0;
  undefined8 local_17a8;
  undefined8 uStack_17a0;
  undefined8 local_1798;
  undefined8 uStack_1790;
  undefined8 *local_1780;
  undefined1 *local_1778;
  undefined8 *local_1770;
  float local_1768;
  float fStack_1764;
  float fStack_1760;
  float fStack_175c;
  undefined8 *local_1750;
  undefined8 local_1748;
  undefined8 uStack_1740;
  undefined8 local_1728;
  undefined8 uStack_1720;
  undefined8 *local_1710;
  undefined8 *local_1708;
  undefined1 *local_1700;
  undefined8 *local_16f8;
  undefined8 *local_16f0;
  undefined8 *local_16e8;
  undefined8 *local_16e0;
  float local_16d8;
  float fStack_16d4;
  float fStack_16d0;
  float fStack_16cc;
  undefined8 *local_16c0;
  undefined8 local_16b8;
  undefined8 uStack_16b0;
  undefined8 local_16a8;
  undefined8 uStack_16a0;
  undefined8 *local_1690;
  undefined1 *local_1688;
  undefined8 *local_1680;
  float local_1678;
  float fStack_1674;
  float fStack_1670;
  float fStack_166c;
  undefined8 *local_1660;
  undefined8 local_1658;
  undefined8 uStack_1650;
  undefined8 local_1638;
  undefined8 uStack_1630;
  undefined8 *local_1620;
  undefined8 *local_1618;
  undefined1 *local_1610;
  undefined8 *local_1608;
  undefined8 *local_1600;
  undefined8 *local_15f8;
  undefined8 *local_15f0;
  float local_15e8;
  float fStack_15e4;
  float fStack_15e0;
  float fStack_15dc;
  undefined8 *local_15d0;
  undefined8 local_15c8;
  undefined8 uStack_15c0;
  undefined8 local_15b8;
  undefined8 uStack_15b0;
  undefined8 *local_15a0;
  undefined1 *local_1598;
  undefined8 *local_1590;
  float local_1588;
  float fStack_1584;
  float fStack_1580;
  float fStack_157c;
  undefined8 *local_1570;
  undefined8 local_1568;
  undefined8 uStack_1560;
  undefined8 local_1548;
  undefined8 uStack_1540;
  undefined8 *local_1530;
  undefined8 *local_1528;
  undefined1 *local_1520;
  undefined8 *local_1518;
  undefined8 *local_1510;
  undefined8 *local_1508;
  undefined8 *local_1500;
  float local_14f8;
  float fStack_14f4;
  float fStack_14f0;
  float fStack_14ec;
  undefined8 *local_14e0;
  undefined8 local_14d8;
  undefined8 uStack_14d0;
  undefined8 local_14c8;
  undefined8 uStack_14c0;
  undefined8 *local_14b0;
  undefined1 *local_14a8;
  undefined8 *local_14a0;
  float local_1498;
  float fStack_1494;
  float fStack_1490;
  float fStack_148c;
  undefined8 *local_1480;
  undefined8 local_1478;
  undefined8 uStack_1470;
  undefined8 local_1458;
  undefined8 uStack_1450;
  undefined8 *local_1440;
  undefined8 *local_1438;
  undefined1 *local_1430;
  undefined8 *local_1428;
  undefined8 *local_1420;
  undefined8 *local_1418;
  undefined8 *local_1410;
  float local_1408;
  float fStack_1404;
  float fStack_1400;
  float fStack_13fc;
  undefined8 *local_13f0;
  undefined8 local_13e8;
  undefined8 uStack_13e0;
  undefined8 local_13d8;
  undefined8 uStack_13d0;
  undefined8 *local_13c0;
  undefined1 *local_13b8;
  undefined8 *local_13b0;
  float local_13a8;
  float fStack_13a4;
  float fStack_13a0;
  float fStack_139c;
  undefined8 *local_1390;
  undefined8 local_1388;
  undefined8 uStack_1380;
  undefined8 local_1368;
  undefined8 uStack_1360;
  undefined8 *local_1350;
  undefined8 *local_1348;
  undefined1 *local_1340;
  undefined8 *local_1338;
  undefined8 *local_1330;
  undefined8 *local_1328;
  undefined8 *local_1320;
  float local_1318;
  float fStack_1314;
  float fStack_1310;
  float fStack_130c;
  undefined8 *local_1300;
  undefined8 local_12f8;
  undefined8 uStack_12f0;
  undefined8 local_12e8;
  undefined8 uStack_12e0;
  undefined8 *local_12d0;
  undefined1 *local_12c8;
  undefined8 *local_12c0;
  float local_12b8;
  float fStack_12b4;
  float fStack_12b0;
  float fStack_12ac;
  undefined8 *local_12a0;
  undefined8 local_1298;
  undefined8 uStack_1290;
  undefined8 local_1278;
  undefined8 uStack_1270;
  undefined8 *local_1260;
  undefined8 *local_1258;
  undefined1 *local_1250;
  undefined8 *local_1248;
  undefined8 *local_1240;
  undefined8 *local_1238;
  undefined8 *local_1230;
  float local_1228;
  float fStack_1224;
  float fStack_1220;
  float fStack_121c;
  undefined8 *local_1210;
  undefined8 local_1208;
  undefined8 uStack_1200;
  undefined8 local_11f8;
  undefined8 uStack_11f0;
  undefined8 *local_11e0;
  undefined1 *local_11d8;
  undefined8 *local_11d0;
  float local_11c8;
  float fStack_11c4;
  float fStack_11c0;
  float fStack_11bc;
  undefined8 *local_11b0;
  undefined8 local_11a8;
  undefined8 uStack_11a0;
  undefined8 local_1188;
  undefined8 uStack_1180;
  undefined8 *local_1170;
  undefined8 *local_1168;
  undefined1 *local_1160;
  undefined8 *local_1158;
  undefined8 *local_1150;
  undefined8 *local_1148;
  undefined8 *local_1140;
  float local_1138;
  float fStack_1134;
  float fStack_1130;
  float fStack_112c;
  undefined8 *local_1120;
  undefined8 local_1118;
  undefined8 uStack_1110;
  undefined8 local_1108;
  undefined8 uStack_1100;
  undefined8 *local_10f0;
  undefined1 *local_10e8;
  undefined8 *local_10e0;
  float local_10d8;
  float fStack_10d4;
  float fStack_10d0;
  float fStack_10cc;
  undefined8 *local_10c0;
  undefined8 local_10b8;
  undefined8 uStack_10b0;
  undefined8 local_1098;
  undefined8 uStack_1090;
  undefined8 *local_1080;
  undefined8 *local_1078;
  undefined1 *local_1070;
  undefined8 *local_1068;
  undefined8 *local_1060;
  undefined8 *local_1058;
  undefined8 *local_1050;
  float local_1048;
  float fStack_1044;
  float fStack_1040;
  float fStack_103c;
  undefined8 *local_1030;
  undefined8 local_1028;
  undefined8 uStack_1020;
  undefined8 local_1018;
  undefined8 uStack_1010;
  undefined8 *local_1000;
  undefined1 *local_ff8;
  undefined8 *local_ff0;
  float local_fe8;
  float fStack_fe4;
  float fStack_fe0;
  float fStack_fdc;
  undefined8 *local_fd0;
  undefined8 local_fc8;
  undefined8 uStack_fc0;
  undefined8 local_fa8;
  undefined8 uStack_fa0;
  undefined8 *local_f90;
  undefined8 *local_f88;
  undefined1 *local_f80;
  undefined8 *local_f78;
  undefined8 *local_f70;
  undefined8 *local_f68;
  undefined8 *local_f60;
  float local_f58;
  float fStack_f54;
  float fStack_f50;
  float fStack_f4c;
  undefined8 *local_f40;
  undefined8 local_f38;
  undefined8 uStack_f30;
  undefined8 local_f28;
  undefined8 uStack_f20;
  undefined8 *local_f10;
  undefined1 *local_f08;
  undefined8 *local_f00;
  float local_ef8;
  float fStack_ef4;
  float fStack_ef0;
  float fStack_eec;
  undefined8 *local_ee0;
  undefined8 local_ed8;
  undefined8 uStack_ed0;
  undefined8 local_eb8;
  undefined8 uStack_eb0;
  undefined8 *local_ea0;
  undefined8 *local_e98;
  undefined1 *local_e90;
  undefined8 *local_e88;
  undefined8 *local_e80;
  undefined8 *local_e78;
  undefined8 *local_e70;
  float local_e68;
  float fStack_e64;
  float fStack_e60;
  float fStack_e5c;
  undefined8 *local_e50;
  undefined8 local_e48;
  undefined8 uStack_e40;
  undefined8 local_e38;
  undefined8 uStack_e30;
  undefined8 *local_e20;
  undefined1 *local_e18;
  undefined8 *local_e10;
  float local_e08;
  float fStack_e04;
  float fStack_e00;
  float fStack_dfc;
  undefined8 *local_df0;
  undefined8 local_de8;
  undefined8 uStack_de0;
  undefined8 local_dc8;
  undefined8 uStack_dc0;
  undefined8 *local_db0;
  undefined8 *local_da8;
  undefined1 *local_da0;
  undefined8 *local_d98;
  undefined8 *local_d90;
  undefined8 *local_d88;
  undefined8 *local_d80;
  float local_d78;
  float fStack_d74;
  float fStack_d70;
  float fStack_d6c;
  undefined8 *local_d60;
  undefined8 local_d58;
  undefined8 uStack_d50;
  undefined8 local_d48;
  undefined8 uStack_d40;
  undefined8 *local_d30;
  undefined1 *local_d28;
  undefined8 *local_d20;
  float local_d18;
  float fStack_d14;
  float fStack_d10;
  float fStack_d0c;
  undefined8 *local_d00;
  undefined8 local_cf8;
  undefined8 uStack_cf0;
  undefined8 local_cd8;
  undefined8 uStack_cd0;
  undefined8 *local_cc0;
  undefined8 *local_cb8;
  undefined1 *local_cb0;
  undefined8 *local_ca8;
  undefined8 *local_ca0;
  undefined8 *local_c98;
  undefined8 *local_c90;
  float local_c88;
  float fStack_c84;
  float fStack_c80;
  float fStack_c7c;
  undefined8 *local_c70;
  undefined8 local_c68;
  undefined8 uStack_c60;
  undefined8 local_c58;
  undefined8 uStack_c50;
  undefined8 *local_c40;
  undefined1 *local_c38;
  undefined8 *local_c30;
  float local_c28;
  float fStack_c24;
  float fStack_c20;
  float fStack_c1c;
  undefined8 *local_c10;
  undefined8 local_c08;
  undefined8 uStack_c00;
  undefined8 local_be8;
  undefined8 uStack_be0;
  undefined8 *local_bd0;
  undefined8 *local_bc8;
  undefined1 *local_bc0;
  undefined8 *local_bb8;
  undefined8 *local_bb0;
  undefined8 *local_ba8;
  undefined8 *local_ba0;
  float local_b98;
  float fStack_b94;
  float fStack_b90;
  float fStack_b8c;
  undefined8 *local_b80;
  undefined8 local_b78;
  undefined8 uStack_b70;
  undefined8 local_b68;
  undefined8 uStack_b60;
  undefined8 *local_b50;
  undefined1 *local_b48;
  undefined8 *local_b40;
  float local_b38;
  float fStack_b34;
  float fStack_b30;
  float fStack_b2c;
  undefined8 *local_b20;
  undefined8 local_b18;
  undefined8 uStack_b10;
  undefined8 local_af8;
  undefined8 uStack_af0;
  undefined8 *local_ae0;
  undefined8 *local_ad8;
  undefined1 *local_ad0;
  undefined8 *local_ac8;
  undefined8 *local_ac0;
  undefined8 *local_ab8;
  undefined8 *local_ab0;
  float local_aa8;
  float fStack_aa4;
  float fStack_aa0;
  float fStack_a9c;
  undefined8 *local_a90;
  undefined8 local_a88;
  undefined8 uStack_a80;
  undefined8 local_a78;
  undefined8 uStack_a70;
  undefined8 *local_a60;
  undefined1 *local_a58;
  undefined8 *local_a50;
  float local_a48;
  float fStack_a44;
  float fStack_a40;
  float fStack_a3c;
  undefined8 *local_a30;
  undefined8 local_a28;
  undefined8 uStack_a20;
  undefined8 local_a08;
  undefined8 uStack_a00;
  undefined8 *local_9f0;
  undefined8 *local_9e8;
  undefined1 *local_9e0;
  undefined8 *local_9d8;
  undefined8 *local_9d0;
  undefined8 *local_9c8;
  undefined8 *local_9c0;
  float local_9b8;
  float fStack_9b4;
  float fStack_9b0;
  float fStack_9ac;
  undefined8 *local_9a0;
  undefined8 local_998;
  undefined8 uStack_990;
  undefined8 local_988;
  undefined8 uStack_980;
  undefined8 *local_970;
  undefined1 *local_968;
  undefined8 *local_960;
  float local_958;
  float fStack_954;
  float fStack_950;
  float fStack_94c;
  undefined8 *local_940;
  undefined8 local_938;
  undefined8 uStack_930;
  undefined8 *local_918;
  undefined8 *local_910;
  undefined8 *local_908;
  undefined8 *local_900;
  undefined8 *local_8f8;
  undefined8 *local_8f0;
  undefined8 *local_8e8;
  undefined8 *local_8e0;
  undefined8 *local_8d8;
  undefined8 *local_8d0;
  undefined8 *local_8c8;
  undefined8 *local_8c0;
  undefined8 *local_8b8;
  undefined8 *local_8b0;
  undefined8 *local_8a8;
  undefined8 *local_8a0;
  undefined8 *local_898;
  undefined8 *local_890;
  undefined8 *local_888;
  undefined8 *local_880;
  undefined8 *local_878;
  undefined8 *local_870;
  undefined8 local_838;
  undefined8 uStack_830;
  float local_6a8;
  float fStack_6a4;
  float fStack_6a0;
  float fStack_69c;
  float local_648;
  float fStack_644;
  float fStack_640;
  float fStack_63c;
  undefined8 local_508;
  undefined8 uStack_500;
  float local_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  undefined4 local_200;
  undefined4 local_1fc;
  undefined4 local_1f8;
  undefined4 local_1f4;
  undefined4 local_1f0;
  undefined4 local_1ec;
  undefined8 *local_1e8;
  undefined8 *local_1e0;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined8 *local_1c8;
  undefined8 *local_1c0;
  undefined8 *local_1b8;
  long *local_1b0;
  long *local_1a8;
  undefined8 *local_1a0;
  undefined8 *local_198;
  undefined8 *local_190;
  undefined8 *local_188;
  undefined8 *local_180;
  undefined8 *local_178;
  undefined8 *local_170;
  undefined8 *local_168;
  undefined8 *local_160;
  undefined8 *local_158;
  undefined8 *local_150;
  undefined8 *local_148;
  undefined8 *local_140;
  undefined4 *local_138;
  undefined4 *local_130;
  undefined4 *local_128;
  long local_120;
  undefined4 *local_118;
  undefined4 *local_110;
  undefined4 *local_108;
  undefined8 *local_100;
  undefined8 *local_f8;
  undefined4 local_ec;
  undefined4 local_e8;
  undefined4 local_e4;
  undefined8 *local_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined4 local_bc;
  undefined4 local_b8;
  undefined4 local_b4;
  undefined4 local_b0;
  undefined4 local_ac;
  undefined4 local_a8;
  undefined4 local_a4;
  undefined8 *local_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined4 local_7c;
  undefined4 local_78;
  undefined4 local_74;
  undefined4 local_70;
  undefined4 local_6c;
  undefined4 local_68;
  undefined4 local_64;
  undefined8 *local_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined4 local_40;
  undefined4 local_3c;
  undefined4 local_38;
  undefined4 local_34;
  undefined8 *local_30;
  undefined8 local_28;
  undefined8 uStack_20;
  
  _local_27e8 = (ulong)in_stack_ffffffffffffd81c << 0x20;
  local_2718 = &local_27b8;
  local_2704 = 0x3f800000;
  local_24ec = 0x3f800000;
  local_2508 = 0x3f800000;
  uStack_2504 = 0x3f800000;
  uStack_2500 = 0x3f800000;
  uStack_24fc = 0x3f800000;
  local_27b8 = 0x3f8000003f800000;
  uStack_27b0 = 0x3f8000003f800000;
  local_2710 = &local_27a8;
  local_1e0 = &local_2748;
  local_1ec = 0;
  local_1f0 = 0;
  local_1f4 = 0;
  local_120 = (long)&local_27b8 + 4;
  local_1f8 = 0;
  local_1fc = 0;
  local_200 = 0;
  local_140 = &uStack_27b0;
  local_108 = &local_1ec;
  local_110 = &local_1f0;
  local_118 = &local_1f4;
  local_128 = &local_1f8;
  local_130 = &local_1fc;
  local_138 = &local_200;
  local_64 = 0x3f800000;
  local_68 = 0;
  local_6c = 0;
  local_34 = 0;
  local_58 = 0x3f800000;
  uStack_50 = 0;
  local_a0 = &local_2738;
  local_a4 = 0;
  local_a8 = 0x3f800000;
  local_ac = 0;
  local_70 = 0;
  local_98 = 0x3f80000000000000;
  uStack_90 = 0;
  local_e0 = &local_2728;
  local_e4 = 0;
  local_e8 = 0;
  local_ec = 0x3f800000;
  local_b0 = 0;
  local_d8 = 0;
  uStack_d0 = 0x3f800000;
  local_190 = &local_2798;
  local_188 = &local_2788;
  local_1a8 = &local_2778;
  local_160 = &local_2738;
  local_158 = &local_2798;
  local_2798 = local_2738;
  uStack_2790 = uStack_2730;
  local_170 = &local_2728;
  local_168 = &local_2788;
  local_2788 = local_2728;
  uStack_2780 = uStack_2720;
  local_30 = &local_1d8;
  local_28 = 0;
  uStack_20 = 0;
  local_1d8 = 0;
  uStack_1d0 = 0;
  local_1b0 = &local_2778;
  local_1b8 = &local_1d8;
  local_2778 = 0;
  pIStack_2770 = (ISPCInstance *)0x0;
  local_27c0 = *(RTCGeometry *)(*in_RDI + 8);
  local_27c4 = 0;
  local_2760 = in_RDX;
  local_2758 = in_RSI;
  local_2700 = local_2718;
  local_1e8 = local_2718;
  local_1c8 = local_1e0;
  local_1c0 = local_2710;
  local_1a0 = local_2710;
  local_198 = local_2710;
  local_180 = local_1e0;
  local_178 = local_2710;
  local_150 = local_1e0;
  local_148 = local_2710;
  local_100 = local_2718;
  local_f8 = local_1e0;
  local_bc = local_e4;
  local_b8 = local_e8;
  local_b4 = local_ec;
  local_7c = local_a4;
  local_78 = local_a8;
  local_74 = local_ac;
  local_60 = local_1e0;
  local_40 = local_64;
  local_3c = local_68;
  local_38 = local_6c;
  local_27a8 = local_58;
  uStack_27a0 = uStack_50;
  local_2748 = local_58;
  uStack_2740 = uStack_50;
  local_2738 = local_98;
  uStack_2730 = uStack_90;
  local_2728 = local_d8;
  uStack_2720 = uStack_d0;
  while ((local_27c4 < 1 &&
         (uVar2 = *(uint *)(local_2758 + 0x4c + (long)local_27c4 * 4), uVar2 != 0xffffffff))) {
    if (**(int **)(local_27c0 + (ulong)uVar2 * 8) == 3) {
      in_stack_ffffffffffffd830 = *(ISPCInstanceArray **)(local_27c0 + (ulong)uVar2 * 8);
      local_2610 = local_2758;
      calculate_interpolated_space(in_stack_ffffffffffffd820,(float)((ulong)_local_27e8 >> 0x20));
      local_2620 = &local_2818;
      local_2628 = &local_27a8;
      local_23e0 = &local_2668;
      local_1c90 = &local_2408;
      local_1c80 = local_1cb8;
      local_1c70 = local_1cd8;
      local_1348 = &local_2798;
      local_1c60 = local_1cf8;
      local_1c00 = &local_2788;
      local_1bf0 = &local_1ce8;
      uVar3 = local_2788;
      uVar4 = uStack_2780;
      local_1bc8._0_4_ = (float)local_2788;
      local_1bc8._4_4_ = (float)((ulong)local_2788 >> 0x20);
      uStack_1bc0._0_4_ = (float)uStack_2780;
      uStack_1bc0._4_4_ = (float)((ulong)uStack_2780 >> 0x20);
      local_1be8 = local_2850 * (float)local_1bc8;
      fStack_1be4 = local_2850 * local_1bc8._4_4_;
      fStack_1be0 = local_2850 * (float)uStack_1bc0;
      fStack_1bdc = local_2850 * uStack_1bc0._4_4_;
      local_1440 = &local_1cc8;
      local_1328 = &local_1368;
      uVar5 = local_2798;
      uVar6 = uStack_2790;
      local_1298._0_4_ = (float)local_2798;
      local_1298._4_4_ = (float)((ulong)local_2798 >> 0x20);
      uStack_1290._0_4_ = (float)uStack_2790;
      uStack_1290._4_4_ = (float)((ulong)uStack_2790 >> 0x20);
      local_12b8 = local_2854 * (float)local_1298;
      fStack_12b4 = local_2854 * local_1298._4_4_;
      fStack_12b0 = local_2854 * (float)uStack_1290;
      fStack_12ac = local_2854 * uStack_1290._4_4_;
      local_12e8 = CONCAT44(fStack_12b4,local_12b8);
      uStack_12e0 = CONCAT44(fStack_12ac,fStack_12b0);
      local_12f8._0_4_ = (float)local_1ce8;
      local_12f8._4_4_ = (float)((ulong)local_1ce8 >> 0x20);
      uStack_12f0._0_4_ = (float)uStack_1ce0;
      uStack_12f0._4_4_ = (float)((ulong)uStack_1ce0 >> 0x20);
      local_1318 = local_12b8 + (float)local_12f8;
      fStack_1314 = fStack_12b4 + local_12f8._4_4_;
      fStack_1310 = fStack_12b0 + (float)uStack_12f0;
      fStack_130c = fStack_12ac + uStack_12f0._4_4_;
      local_1418 = &local_1458;
      local_1388._0_4_ = (float)local_27a8;
      local_1388._4_4_ = (float)((ulong)local_27a8 >> 0x20);
      uStack_1380._0_4_ = (float)uStack_27a0;
      uStack_1380._4_4_ = (float)((ulong)uStack_27a0 >> 0x20);
      local_13a8 = local_2858 * (float)local_1388;
      fStack_13a4 = local_2858 * local_1388._4_4_;
      fStack_13a0 = local_2858 * (float)uStack_1380;
      fStack_139c = local_2858 * uStack_1380._4_4_;
      local_13d8 = CONCAT44(fStack_13a4,local_13a8);
      uStack_13d0 = CONCAT44(fStack_139c,fStack_13a0);
      local_13e8._0_4_ = (float)local_1cc8;
      local_13e8._4_4_ = (float)((ulong)local_1cc8 >> 0x20);
      uStack_13e0._0_4_ = (float)uStack_1cc0;
      uStack_13e0._4_4_ = (float)((ulong)uStack_1cc0 >> 0x20);
      local_1408 = local_13a8 + (float)local_13e8;
      fStack_1404 = fStack_13a4 + local_13e8._4_4_;
      fStack_1400 = fStack_13a0 + (float)uStack_13e0;
      fStack_13fc = fStack_139c + uStack_13e0._4_4_;
      local_2818 = CONCAT44(fStack_1404,local_1408);
      uStackY_2810 = CONCAT44(fStack_13fc,fStack_1400);
      local_1df0 = &local_2848;
      local_1de0 = &local_2418;
      local_1dd0 = local_1e08;
      local_1dc0 = local_1e28;
      local_1168 = &local_2798;
      local_1db0 = local_1e48;
      local_1d50 = &local_2788;
      local_1d40 = &local_1e38;
      local_1d18 = local_2788;
      uStack_1d10 = uStack_2780;
      local_1d38 = local_2840 * (float)local_1bc8;
      fStack_1d34 = local_2840 * local_1bc8._4_4_;
      fStack_1d30 = local_2840 * (float)uStack_1bc0;
      fStack_1d2c = local_2840 * uStack_1bc0._4_4_;
      local_1260 = &local_1e18;
      local_1148 = &local_1188;
      local_10b8 = local_2798;
      uStack_10b0 = uStack_2790;
      local_10d8 = local_2844 * (float)local_1298;
      fStack_10d4 = local_2844 * local_1298._4_4_;
      fStack_10d0 = local_2844 * (float)uStack_1290;
      fStack_10cc = local_2844 * uStack_1290._4_4_;
      local_1108 = CONCAT44(fStack_10d4,local_10d8);
      uStack_1100 = CONCAT44(fStack_10cc,fStack_10d0);
      local_1118._0_4_ = (float)local_1e38;
      local_1118._4_4_ = (float)((ulong)local_1e38 >> 0x20);
      uStack_1110._0_4_ = (float)uStack_1e30;
      uStack_1110._4_4_ = (float)((ulong)uStack_1e30 >> 0x20);
      local_1138 = local_10d8 + (float)local_1118;
      fStack_1134 = fStack_10d4 + local_1118._4_4_;
      fStack_1130 = fStack_10d0 + (float)uStack_1110;
      fStack_112c = fStack_10cc + uStack_1110._4_4_;
      local_1238 = &local_1278;
      local_11a8 = local_27a8;
      uStack_11a0 = uStack_27a0;
      local_11c8 = local_2848 * (float)local_1388;
      fStack_11c4 = local_2848 * local_1388._4_4_;
      fStack_11c0 = local_2848 * (float)uStack_1380;
      fStack_11bc = local_2848 * uStack_1380._4_4_;
      local_11f8 = CONCAT44(fStack_11c4,local_11c8);
      uStack_11f0 = CONCAT44(fStack_11bc,fStack_11c0);
      local_1208._0_4_ = (float)local_1e18;
      local_1208._4_4_ = (float)((ulong)local_1e18 >> 0x20);
      uStack_1200._0_4_ = (float)uStack_1e10;
      uStack_1200._4_4_ = (float)((ulong)uStack_1e10 >> 0x20);
      local_1228 = local_11c8 + (float)local_1208;
      fStack_1224 = fStack_11c4 + local_1208._4_4_;
      fStack_1220 = fStack_11c0 + (float)uStack_1200;
      fStack_121c = fStack_11bc + uStack_1200._4_4_;
      local_1f40 = &local_2838;
      local_1f30 = &local_2428;
      local_1f20 = local_1f58;
      local_1f10 = local_1f78;
      local_f88 = &local_2798;
      local_1f00 = local_1f98;
      local_1ea0 = &local_2788;
      local_1e90 = &local_1f88;
      local_1e68 = local_2788;
      uStack_1e60 = uStack_2780;
      local_1e88 = local_2830 * (float)local_1bc8;
      fStack_1e84 = local_2830 * local_1bc8._4_4_;
      fStack_1e80 = local_2830 * (float)uStack_1bc0;
      fStack_1e7c = local_2830 * uStack_1bc0._4_4_;
      local_1080 = &local_1f68;
      local_f68 = &local_fa8;
      local_ed8 = local_2798;
      uStack_ed0 = uStack_2790;
      local_ef8 = local_2834 * (float)local_1298;
      fStack_ef4 = local_2834 * local_1298._4_4_;
      fStack_ef0 = local_2834 * (float)uStack_1290;
      fStack_eec = local_2834 * uStack_1290._4_4_;
      local_f28 = CONCAT44(fStack_ef4,local_ef8);
      uStack_f20 = CONCAT44(fStack_eec,fStack_ef0);
      local_f38._0_4_ = (float)local_1f88;
      local_f38._4_4_ = (float)((ulong)local_1f88 >> 0x20);
      uStack_f30._0_4_ = (float)uStack_1f80;
      uStack_f30._4_4_ = (float)((ulong)uStack_1f80 >> 0x20);
      local_f58 = local_ef8 + (float)local_f38;
      fStack_f54 = fStack_ef4 + local_f38._4_4_;
      fStack_f50 = fStack_ef0 + (float)uStack_f30;
      fStack_f4c = fStack_eec + uStack_f30._4_4_;
      local_1058 = &local_1098;
      local_fc8 = local_27a8;
      uStack_fc0 = uStack_27a0;
      local_fe8 = local_2838 * (float)local_1388;
      fStack_fe4 = local_2838 * local_1388._4_4_;
      fStack_fe0 = local_2838 * (float)uStack_1380;
      fStack_fdc = local_2838 * uStack_1380._4_4_;
      local_1018 = CONCAT44(fStack_fe4,local_fe8);
      uStack_1010 = CONCAT44(fStack_fdc,fStack_fe0);
      local_1028._0_4_ = (float)local_1f68;
      local_1028._4_4_ = (float)((ulong)local_1f68 >> 0x20);
      uStack_1020._0_4_ = (float)uStack_1f60;
      uStack_1020._4_4_ = (float)((ulong)uStack_1f60 >> 0x20);
      local_1048 = local_fe8 + (float)local_1028;
      fStack_1044 = fStack_fe4 + local_1028._4_4_;
      fStack_1040 = fStack_fe0 + (float)uStack_1020;
      fStack_103c = fStack_fdc + uStack_1020._4_4_;
      local_1830 = &local_2658;
      local_1820 = &local_2648;
      local_1b50 = &local_2828;
      local_1b40 = &local_2688;
      local_1b30 = local_1b68;
      local_1b20 = local_1b88;
      local_1528 = &local_2798;
      local_1b10 = local_1ba8;
      local_1ab0 = &local_2788;
      local_1aa0 = &local_1b98;
      local_1aa8 = local_1ba8;
      local_1a78 = local_2788;
      uStack_1a70 = uStack_2780;
      local_1a98 = local_2820 * (float)local_1bc8;
      fStack_1a94 = local_2820 * local_1bc8._4_4_;
      fStack_1a90 = local_2820 * (float)uStack_1bc0;
      fStack_1a8c = local_2820 * uStack_1bc0._4_4_;
      local_1a80 = &local_1b98;
      local_1518 = &local_1b78;
      local_1520 = local_1b88;
      local_1530 = &local_1b98;
      local_14a0 = &local_1548;
      local_1478 = local_2798;
      uStack_1470 = uStack_2790;
      local_1498 = local_2824 * (float)local_1298;
      fStack_1494 = local_2824 * local_1298._4_4_;
      fStack_1490 = local_2824 * (float)uStack_1290;
      fStack_148c = local_2824 * uStack_1290._4_4_;
      local_1480 = &local_1548;
      local_14c8 = CONCAT44(fStack_1494,local_1498);
      uStack_14c0 = CONCAT44(fStack_148c,fStack_1490);
      local_1500 = &local_1b78;
      local_1508 = &local_1548;
      local_14d8._0_4_ = (float)local_1b98;
      local_14d8._4_4_ = (float)((ulong)local_1b98 >> 0x20);
      uStack_14d0._0_4_ = (float)uStack_1b90;
      uStack_14d0._4_4_ = (float)((ulong)uStack_1b90 >> 0x20);
      local_14f8 = local_1498 + (float)local_14d8;
      fStack_14f4 = fStack_1494 + local_14d8._4_4_;
      fStack_14f0 = fStack_1490 + (float)uStack_14d0;
      fStack_14ec = fStack_148c + uStack_14d0._4_4_;
      local_14e0 = &local_1b78;
      local_1608 = &local_2688;
      local_1610 = local_1b68;
      local_1620 = &local_1b78;
      local_1590 = &local_1638;
      local_1568 = local_27a8;
      uStack_1560 = uStack_27a0;
      local_1588 = local_2828 * (float)local_1388;
      fStack_1584 = local_2828 * local_1388._4_4_;
      fStack_1580 = local_2828 * (float)uStack_1380;
      fStack_157c = local_2828 * uStack_1380._4_4_;
      local_1570 = &local_1638;
      local_15b8 = CONCAT44(fStack_1584,local_1588);
      uStack_15b0 = CONCAT44(fStack_157c,fStack_1580);
      local_15f0 = &local_2688;
      local_15f8 = &local_1638;
      local_15c8._0_4_ = (float)local_1b78;
      local_15c8._4_4_ = (float)((ulong)local_1b78 >> 0x20);
      uStack_15c0._0_4_ = (float)uStack_1b70;
      uStack_15c0._4_4_ = (float)((ulong)uStack_1b70 >> 0x20);
      local_15e8 = local_1588 + (float)local_15c8;
      fStack_15e4 = fStack_1584 + local_15c8._4_4_;
      fStack_15e0 = fStack_1580 + (float)uStack_15c0;
      fStack_15dc = fStack_157c + uStack_15c0._4_4_;
      local_15d0 = &local_2688;
      local_24b8 = CONCAT44(fStack_15e4,local_15e8);
      uStack_24b0 = CONCAT44(fStack_15dc,fStack_15e0);
      local_2578 = &local_2778;
      local_2568 = &local_2678;
      local_2570 = &local_2688;
      _local_27e8 = local_2778;
      pIVar7 = pIStack_2770;
      local_24c8._0_4_ = (float)local_2778;
      local_24c8._4_4_ = (float)((ulong)local_2778 >> 0x20);
      uStack_24c0._0_4_ = SUB84(pIStack_2770,0);
      uStack_24c0._4_4_ = (float)((ulong)pIStack_2770 >> 0x20);
      local_2528 = local_15e8 + (float)local_24c8;
      fStack_2524 = fStack_15e4 + local_24c8._4_4_;
      fStack_2520 = fStack_15e0 + (float)uStack_24c0;
      fStack_251c = fStack_15dc + uStack_24c0._4_4_;
      local_2510 = &local_2678;
      local_18f8 = &local_2818;
      local_1900 = &local_2668;
      local_1908 = &local_2678;
      local_878 = &local_2808;
      local_870 = &local_27f8;
      local_8a0 = &local_2658;
      local_898 = &local_2808;
      local_8b0 = &local_2648;
      local_8a8 = &local_27f8;
      local_18e8 = local_27e8;
      local_25f0 = &local_27a8;
      local_25f8 = &local_2818;
      local_2488 = &local_2808;
      local_2480 = &local_2798;
      local_2798 = local_2808;
      uStack_2790 = uStackY_2800;
      local_2498 = &local_27f8;
      local_2490 = &local_2788;
      local_2788 = local_27f8;
      uStack_2780 = uStackY_27f0;
      local_25b8 = local_27e8;
      local_25b0 = &local_2778;
      local_2778 = local_2678;
      pIStack_2770 = pIStack_2670;
      local_27c0 = in_stack_ffffffffffffd830->child[1].geometry;
      in_stack_ffffffffffffd820 = pIStack_2670;
      local_2630 = &local_2858;
      local_24c8 = _local_27e8;
      uStack_24c0 = pIVar7;
      local_24a8 = local_25f8;
      local_24a0 = local_25f0;
      local_2478 = local_25f8;
      local_2470 = local_25f0;
      local_23f0 = &local_2858;
      local_23e8 = local_2628;
      local_1f38 = local_2628;
      local_1e98 = local_1f00;
      local_1e70 = local_1e90;
      local_1de8 = local_2628;
      local_1d48 = local_1db0;
      local_1d20 = local_1d40;
      local_1ca0 = &local_2858;
      local_1c98 = local_2628;
      local_1bf8 = local_1c60;
      local_1bd0 = local_1bf0;
      local_1bc8 = uVar3;
      uStack_1bc0 = uVar4;
      local_1b48 = local_2628;
      local_18f0 = local_1908;
      local_1868 = local_1f30;
      local_1860 = local_1de0;
      local_1858 = local_1c90;
      local_1850 = local_23e0;
      local_1848 = local_1c90;
      local_1840 = local_23e0;
      local_1838 = local_1de0;
      local_1828 = local_1f30;
      local_1618 = local_2628;
      local_1600 = local_1620;
      local_15c8 = local_1b78;
      uStack_15c0 = uStack_1b70;
      local_15a0 = local_2628;
      local_1598 = local_1610;
      local_1510 = local_1530;
      local_14d8 = local_1b98;
      uStack_14d0 = uStack_1b90;
      local_14b0 = local_1528;
      local_14a8 = local_1520;
      local_1438 = local_2628;
      local_1430 = local_1c80;
      local_1428 = local_1c90;
      local_1420 = local_1440;
      local_1410 = local_1c90;
      local_13f0 = local_1c90;
      local_13e8 = local_1cc8;
      uStack_13e0 = uStack_1cc0;
      local_13c0 = local_2628;
      local_13b8 = local_1c80;
      local_13b0 = local_1418;
      local_1390 = local_1418;
      local_1388 = local_27a8;
      uStack_1380 = uStack_27a0;
      local_1350 = local_1bf0;
      local_1340 = local_1c70;
      local_1338 = local_1440;
      local_1330 = local_1bf0;
      local_1320 = local_1440;
      local_1300 = local_1440;
      local_12f8 = local_1ce8;
      uStack_12f0 = uStack_1ce0;
      local_12d0 = local_1348;
      local_12c8 = local_1c70;
      local_12c0 = local_1328;
      local_12a0 = local_1328;
      local_1298 = uVar5;
      uStack_1290 = uVar6;
      local_1258 = local_2628;
      local_1250 = local_1dd0;
      local_1248 = local_1de0;
      local_1240 = local_1260;
      local_1230 = local_1de0;
      local_1210 = local_1de0;
      local_1208 = local_1e18;
      uStack_1200 = uStack_1e10;
      local_11e0 = local_2628;
      local_11d8 = local_1dd0;
      local_11d0 = local_1238;
      local_11b0 = local_1238;
      local_1170 = local_1d40;
      local_1160 = local_1dc0;
      local_1158 = local_1260;
      local_1150 = local_1d40;
      local_1140 = local_1260;
      local_1120 = local_1260;
      local_1118 = local_1e38;
      uStack_1110 = uStack_1e30;
      local_10f0 = local_1168;
      local_10e8 = local_1dc0;
      local_10e0 = local_1148;
      local_10c0 = local_1148;
      local_1078 = local_2628;
      local_1070 = local_1f20;
      local_1068 = local_1f30;
      local_1060 = local_1080;
      local_1050 = local_1f30;
      local_1030 = local_1f30;
      local_1028 = local_1f68;
      uStack_1020 = uStack_1f60;
      local_1000 = local_2628;
      local_ff8 = local_1f20;
      local_ff0 = local_1058;
      local_fd0 = local_1058;
      local_f90 = local_1e90;
      local_f80 = local_1f10;
      local_f78 = local_1080;
      local_f70 = local_1e90;
      local_f60 = local_1080;
      local_f40 = local_1080;
      local_f38 = local_1f88;
      uStack_f30 = uStack_1f80;
      local_f10 = local_f88;
      local_f08 = local_1f10;
      local_f00 = local_f68;
      local_ee0 = local_f68;
      local_8c0 = local_1900;
      local_8b8 = local_18f8;
      local_890 = local_1900;
      local_888 = local_18f8;
      local_880 = local_18f8;
      local_2808 = local_2658;
      uStackY_2800 = uStack_2650;
      local_27f8 = local_2648;
      uStackY_27f0 = uStack_2640;
      local_27a8 = local_2818;
      uStack_27a0 = uStackY_2810;
      local_2688 = local_24b8;
      uStack_2680 = uStack_24b0;
      local_2678 = CONCAT44(fStack_2524,local_2528);
      pIStack_2670 = (ISPCInstance *)CONCAT44(fStack_251c,fStack_2520);
      local_2668 = local_2818;
      uStack_2660 = uStackY_2810;
      local_2658 = local_2418;
      uStack_2650 = uStack_2410;
      local_2648 = local_2428;
      uStack_2640 = uStack_2420;
      local_2428 = CONCAT44(fStack_1044,local_1048);
      uStack_2420 = CONCAT44(fStack_103c,fStack_1040);
      local_2418 = CONCAT44(fStack_1224,local_1228);
      uStack_2410 = CONCAT44(fStack_121c,fStack_1220);
      local_2408 = local_2818;
      uStack_2400 = uStackY_2810;
      local_1f88 = CONCAT44(fStack_1e84,local_1e88);
      uStack_1f80 = CONCAT44(fStack_1e7c,fStack_1e80);
      local_1f68 = CONCAT44(fStack_f54,local_f58);
      uStack_1f60 = CONCAT44(fStack_f4c,fStack_f50);
      local_1e38 = CONCAT44(fStack_1d34,local_1d38);
      uStack_1e30 = CONCAT44(fStack_1d2c,fStack_1d30);
      local_1e18 = CONCAT44(fStack_1134,local_1138);
      uStack_1e10 = CONCAT44(fStack_112c,fStack_1130);
      local_1ce8 = CONCAT44(fStack_1be4,local_1be8);
      uStack_1ce0 = CONCAT44(fStack_1bdc,fStack_1be0);
      local_1cc8 = CONCAT44(fStack_1314,local_1318);
      uStack_1cc0 = CONCAT44(fStack_130c,fStack_1310);
      local_1b98 = CONCAT44(fStack_1a94,local_1a98);
      uStack_1b90 = CONCAT44(fStack_1a8c,fStack_1a90);
      local_1b78 = CONCAT44(fStack_14f4,local_14f8);
      uStack_1b70 = CONCAT44(fStack_14ec,fStack_14f0);
      local_1638 = local_15b8;
      uStack_1630 = uStack_15b0;
      local_1548 = local_14c8;
      uStack_1540 = uStack_14c0;
      local_1458 = local_13d8;
      uStack_1450 = uStack_13d0;
      local_1368 = local_12e8;
      uStack_1360 = uStack_12e0;
      local_1278 = local_11f8;
      uStack_1270 = uStack_11f0;
      local_1188 = local_1108;
      uStack_1180 = uStack_1100;
      local_1098 = local_1018;
      uStack_1090 = uStack_1010;
      local_fa8 = local_f28;
      uStack_fa0 = uStack_f20;
      _local_27e8 = local_2678;
    }
    else if (**(int **)(local_27c0 + (ulong)uVar2 * 8) == 4) {
      local_2860 = *(long *)(local_27c0 + (ulong)uVar2 * 8);
      local_2618 = local_2758;
      calculate_interpolated_space
                (in_stack_ffffffffffffd830,in_stack_ffffffffffffd82c,in_stack_ffffffffffffd828);
      local_2690 = &local_28a8;
      local_2698 = &local_27a8;
      local_2390 = &local_26d8;
      local_2080 = &local_23b8;
      local_2070 = local_20a8;
      local_2060 = local_20c8;
      local_da8 = &local_2798;
      local_2050 = local_20e8;
      local_1ff0 = &local_2788;
      local_1fe0 = &local_20d8;
      uVar3 = local_2788;
      uVar4 = uStack_2780;
      local_1fb8._0_4_ = (float)local_2788;
      local_1fb8._4_4_ = (float)((ulong)local_2788 >> 0x20);
      uStack_1fb0._0_4_ = (float)uStack_2780;
      uStack_1fb0._4_4_ = (float)((ulong)uStack_2780 >> 0x20);
      local_1fd8 = local_28e0 * (float)local_1fb8;
      fStack_1fd4 = local_28e0 * local_1fb8._4_4_;
      fStack_1fd0 = local_28e0 * (float)uStack_1fb0;
      fStack_1fcc = local_28e0 * uStack_1fb0._4_4_;
      local_ea0 = &local_20b8;
      local_d88 = &local_dc8;
      uVar5 = local_2798;
      uVar6 = uStack_2790;
      local_cf8._0_4_ = (float)local_2798;
      local_cf8._4_4_ = (float)((ulong)local_2798 >> 0x20);
      uStack_cf0._0_4_ = (float)uStack_2790;
      uStack_cf0._4_4_ = (float)((ulong)uStack_2790 >> 0x20);
      local_d18 = local_28e4 * (float)local_cf8;
      fStack_d14 = local_28e4 * local_cf8._4_4_;
      fStack_d10 = local_28e4 * (float)uStack_cf0;
      fStack_d0c = local_28e4 * uStack_cf0._4_4_;
      local_d48 = CONCAT44(fStack_d14,local_d18);
      uStack_d40 = CONCAT44(fStack_d0c,fStack_d10);
      local_d58._0_4_ = (float)local_20d8;
      local_d58._4_4_ = (float)((ulong)local_20d8 >> 0x20);
      uStack_d50._0_4_ = (float)uStack_20d0;
      uStack_d50._4_4_ = (float)((ulong)uStack_20d0 >> 0x20);
      local_d78 = local_d18 + (float)local_d58;
      fStack_d74 = fStack_d14 + local_d58._4_4_;
      fStack_d70 = fStack_d10 + (float)uStack_d50;
      fStack_d6c = fStack_d0c + uStack_d50._4_4_;
      local_e78 = &local_eb8;
      local_de8._0_4_ = (float)local_27a8;
      local_de8._4_4_ = (float)((ulong)local_27a8 >> 0x20);
      uStack_de0._0_4_ = (float)uStack_27a0;
      uStack_de0._4_4_ = (float)((ulong)uStack_27a0 >> 0x20);
      local_e08 = local_28e8 * (float)local_de8;
      fStack_e04 = local_28e8 * local_de8._4_4_;
      fStack_e00 = local_28e8 * (float)uStack_de0;
      fStack_dfc = local_28e8 * uStack_de0._4_4_;
      local_e38 = CONCAT44(fStack_e04,local_e08);
      uStack_e30 = CONCAT44(fStack_dfc,fStack_e00);
      local_e48._0_4_ = (float)local_20b8;
      local_e48._4_4_ = (float)((ulong)local_20b8 >> 0x20);
      uStack_e40._0_4_ = (float)uStack_20b0;
      uStack_e40._4_4_ = (float)((ulong)uStack_20b0 >> 0x20);
      local_e68 = local_e08 + (float)local_e48;
      fStack_e64 = fStack_e04 + local_e48._4_4_;
      fStack_e60 = fStack_e00 + (float)uStack_e40;
      fStack_e5c = fStack_dfc + uStack_e40._4_4_;
      local_28a8 = CONCAT44(fStack_e64,local_e68);
      uStackY_28a0 = CONCAT44(fStack_e5c,fStack_e60);
      local_21e0 = &local_28d8;
      local_21d0 = &local_23c8;
      local_21c0 = local_21f8;
      local_21b0 = local_2218;
      local_bc8 = &local_2798;
      local_21a0 = local_2238;
      local_2140 = &local_2788;
      local_2130 = &local_2228;
      local_2108 = local_2788;
      uStack_2100 = uStack_2780;
      local_2128 = local_28d0 * (float)local_1fb8;
      fStack_2124 = local_28d0 * local_1fb8._4_4_;
      fStack_2120 = local_28d0 * (float)uStack_1fb0;
      fStack_211c = local_28d0 * uStack_1fb0._4_4_;
      local_cc0 = &local_2208;
      local_ba8 = &local_be8;
      local_b18 = local_2798;
      uStack_b10 = uStack_2790;
      local_b38 = local_28d4 * (float)local_cf8;
      fStack_b34 = local_28d4 * local_cf8._4_4_;
      fStack_b30 = local_28d4 * (float)uStack_cf0;
      fStack_b2c = local_28d4 * uStack_cf0._4_4_;
      local_b68 = CONCAT44(fStack_b34,local_b38);
      uStack_b60 = CONCAT44(fStack_b2c,fStack_b30);
      local_b78._0_4_ = (float)local_2228;
      local_b78._4_4_ = (float)((ulong)local_2228 >> 0x20);
      uStack_b70._0_4_ = (float)uStack_2220;
      uStack_b70._4_4_ = (float)((ulong)uStack_2220 >> 0x20);
      local_b98 = local_b38 + (float)local_b78;
      fStack_b94 = fStack_b34 + local_b78._4_4_;
      fStack_b90 = fStack_b30 + (float)uStack_b70;
      fStack_b8c = fStack_b2c + uStack_b70._4_4_;
      local_c98 = &local_cd8;
      local_c08 = local_27a8;
      uStack_c00 = uStack_27a0;
      local_c28 = local_28d8 * (float)local_de8;
      fStack_c24 = local_28d8 * local_de8._4_4_;
      fStack_c20 = local_28d8 * (float)uStack_de0;
      fStack_c1c = local_28d8 * uStack_de0._4_4_;
      local_c58 = CONCAT44(fStack_c24,local_c28);
      uStack_c50 = CONCAT44(fStack_c1c,fStack_c20);
      local_c68._0_4_ = (float)local_2208;
      local_c68._4_4_ = (float)((ulong)local_2208 >> 0x20);
      uStack_c60._0_4_ = (float)uStack_2200;
      uStack_c60._4_4_ = (float)((ulong)uStack_2200 >> 0x20);
      local_c88 = local_c28 + (float)local_c68;
      fStack_c84 = fStack_c24 + local_c68._4_4_;
      fStack_c80 = fStack_c20 + (float)uStack_c60;
      fStack_c7c = fStack_c1c + uStack_c60._4_4_;
      local_2330 = &local_28c8;
      local_2320 = &local_23d8;
      local_2310 = local_2348;
      local_2300 = local_2368;
      local_9e8 = &local_2798;
      local_22f0 = local_2388;
      local_2290 = &local_2788;
      local_2280 = &local_2378;
      local_2258 = local_2788;
      uStack_2250 = uStack_2780;
      local_2278 = local_28c0 * (float)local_1fb8;
      fStack_2274 = local_28c0 * local_1fb8._4_4_;
      fStack_2270 = local_28c0 * (float)uStack_1fb0;
      fStack_226c = local_28c0 * uStack_1fb0._4_4_;
      local_ae0 = &local_2358;
      local_9c8 = &local_a08;
      local_938 = local_2798;
      uStack_930 = uStack_2790;
      local_958 = local_28c4 * (float)local_cf8;
      fStack_954 = local_28c4 * local_cf8._4_4_;
      fStack_950 = local_28c4 * (float)uStack_cf0;
      fStack_94c = local_28c4 * uStack_cf0._4_4_;
      local_988 = CONCAT44(fStack_954,local_958);
      uStack_980 = CONCAT44(fStack_94c,fStack_950);
      local_998._0_4_ = (float)local_2378;
      local_998._4_4_ = (float)((ulong)local_2378 >> 0x20);
      uStack_990._0_4_ = (float)uStack_2370;
      uStack_990._4_4_ = (float)((ulong)uStack_2370 >> 0x20);
      local_9b8 = local_958 + (float)local_998;
      fStack_9b4 = fStack_954 + local_998._4_4_;
      fStack_9b0 = fStack_950 + (float)uStack_990;
      fStack_9ac = fStack_94c + uStack_990._4_4_;
      local_ab8 = &local_af8;
      local_a28 = local_27a8;
      uStack_a20 = uStack_27a0;
      local_a48 = local_28c8 * (float)local_de8;
      fStack_a44 = local_28c8 * local_de8._4_4_;
      fStack_a40 = local_28c8 * (float)uStack_de0;
      fStack_a3c = local_28c8 * uStack_de0._4_4_;
      local_a78 = CONCAT44(fStack_a44,local_a48);
      uStack_a70 = CONCAT44(fStack_a3c,fStack_a40);
      local_a88._0_4_ = (float)local_2358;
      local_a88._4_4_ = (float)((ulong)local_2358 >> 0x20);
      uStack_a80._0_4_ = (float)uStack_2350;
      uStack_a80._4_4_ = (float)((ulong)uStack_2350 >> 0x20);
      local_aa8 = local_a48 + (float)local_a88;
      fStack_aa4 = fStack_a44 + local_a88._4_4_;
      fStack_aa0 = fStack_a40 + (float)uStack_a80;
      fStack_a9c = fStack_a3c + uStack_a80._4_4_;
      local_1880 = &local_26c8;
      local_1870 = &local_26b8;
      local_1a00 = &local_28b8;
      local_19f0 = &local_26f8;
      local_19e0 = local_1a18;
      local_19d0 = local_1a38;
      local_1708 = &local_2798;
      local_19c0 = local_1a58;
      local_1960 = &local_2788;
      local_1950 = &local_1a48;
      local_1958 = local_1a58;
      local_1928 = local_2788;
      uStack_1920 = uStack_2780;
      local_1948 = local_28b0 * (float)local_1fb8;
      fStack_1944 = local_28b0 * local_1fb8._4_4_;
      fStack_1940 = local_28b0 * (float)uStack_1fb0;
      fStack_193c = local_28b0 * uStack_1fb0._4_4_;
      local_1930 = &local_1a48;
      local_16f8 = &local_1a28;
      local_1700 = local_1a38;
      local_1710 = &local_1a48;
      local_1680 = &local_1728;
      local_1658 = local_2798;
      uStack_1650 = uStack_2790;
      local_1678 = local_28b4 * (float)local_cf8;
      fStack_1674 = local_28b4 * local_cf8._4_4_;
      fStack_1670 = local_28b4 * (float)uStack_cf0;
      fStack_166c = local_28b4 * uStack_cf0._4_4_;
      local_1660 = &local_1728;
      local_16a8 = CONCAT44(fStack_1674,local_1678);
      uStack_16a0 = CONCAT44(fStack_166c,fStack_1670);
      local_16e0 = &local_1a28;
      local_16e8 = &local_1728;
      local_16b8._0_4_ = (float)local_1a48;
      local_16b8._4_4_ = (float)((ulong)local_1a48 >> 0x20);
      uStack_16b0._0_4_ = (float)uStack_1a40;
      uStack_16b0._4_4_ = (float)((ulong)uStack_1a40 >> 0x20);
      local_16d8 = local_1678 + (float)local_16b8;
      fStack_16d4 = fStack_1674 + local_16b8._4_4_;
      fStack_16d0 = fStack_1670 + (float)uStack_16b0;
      fStack_16cc = fStack_166c + uStack_16b0._4_4_;
      local_16c0 = &local_1a28;
      local_17e8 = &local_26f8;
      local_17f0 = local_1a18;
      local_1800 = &local_1a28;
      local_1770 = &local_1818;
      local_1748 = local_27a8;
      uStack_1740 = uStack_27a0;
      local_1768 = local_28b8 * (float)local_de8;
      fStack_1764 = local_28b8 * local_de8._4_4_;
      fStack_1760 = local_28b8 * (float)uStack_de0;
      fStack_175c = local_28b8 * uStack_de0._4_4_;
      local_1750 = &local_1818;
      local_1798 = CONCAT44(fStack_1764,local_1768);
      uStack_1790 = CONCAT44(fStack_175c,fStack_1760);
      local_17d0 = &local_26f8;
      local_17d8 = &local_1818;
      local_17a8._0_4_ = (float)local_1a28;
      local_17a8._4_4_ = (float)((ulong)local_1a28 >> 0x20);
      uStack_17a0._0_4_ = (float)uStack_1a20;
      uStack_17a0._4_4_ = (float)((ulong)uStack_1a20 >> 0x20);
      local_17c8 = local_1768 + (float)local_17a8;
      fStack_17c4 = fStack_1764 + local_17a8._4_4_;
      fStack_17c0 = fStack_1760 + (float)uStack_17a0;
      fStack_17bc = fStack_175c + uStack_17a0._4_4_;
      local_17b0 = &local_26f8;
      local_24d8 = CONCAT44(fStack_17c4,local_17c8);
      uStack_24d0 = CONCAT44(fStack_17bc,fStack_17c0);
      local_2560 = &local_2778;
      local_2550 = &local_26e8;
      local_2558 = &local_26f8;
      lVar8 = local_2778;
      pIVar7 = pIStack_2770;
      local_24e8._0_4_ = (float)local_2778;
      local_24e8._4_4_ = (float)((ulong)local_2778 >> 0x20);
      uStack_24e0._0_4_ = SUB84(pIStack_2770,0);
      uStack_24e0._4_4_ = (float)((ulong)pIStack_2770 >> 0x20);
      local_2548 = local_17c8 + (float)local_24e8;
      fStack_2544 = fStack_17c4 + local_24e8._4_4_;
      fStack_2540 = fStack_17c0 + (float)uStack_24e0;
      fStack_253c = fStack_17bc + uStack_24e0._4_4_;
      local_2530 = &local_26e8;
      local_18d0 = &local_28a8;
      local_18d8 = &local_26d8;
      local_18e0 = &local_26e8;
      local_8d0 = &local_2898;
      local_8c8 = &local_2888;
      local_8f8 = &local_26c8;
      local_8f0 = &local_2898;
      local_908 = &local_26b8;
      local_900 = &local_2888;
      local_18c0 = &local_2878;
      local_2600 = &local_27a8;
      local_2608 = &local_28a8;
      local_2448 = &local_2898;
      local_2440 = &local_2798;
      local_2798 = local_2898;
      uStack_2790 = uStackY_2890;
      local_2458 = &local_2888;
      local_2450 = &local_2788;
      local_2788 = local_2888;
      uStack_2780 = uStackY_2880;
      local_25a8 = &local_2878;
      local_25a0 = &local_2778;
      local_2778 = local_2878;
      pIStack_2770 = pIStackY_2870;
      local_27c0 = *(RTCGeometry *)(*(long *)(local_2860 + 0x18) + 0x20);
      local_26a0 = &local_28e8;
      local_24e8 = lVar8;
      uStack_24e0 = pIVar7;
      local_2468 = local_2608;
      local_2460 = local_2600;
      local_2438 = local_2608;
      local_2430 = local_2600;
      local_23a0 = &local_28e8;
      local_2398 = local_2698;
      local_2328 = local_2698;
      local_2288 = local_22f0;
      local_2260 = local_2280;
      local_21d8 = local_2698;
      local_2138 = local_21a0;
      local_2110 = local_2130;
      local_2090 = &local_28e8;
      local_2088 = local_2698;
      local_1fe8 = local_2050;
      local_1fc0 = local_1fe0;
      local_1fb8 = uVar3;
      uStack_1fb0 = uVar4;
      local_19f8 = local_2698;
      local_18c8 = local_18e0;
      local_18b8 = local_2320;
      local_18b0 = local_21d0;
      local_18a8 = local_2080;
      local_18a0 = local_2390;
      local_1898 = local_2080;
      local_1890 = local_2390;
      local_1888 = local_21d0;
      local_1878 = local_2320;
      local_17f8 = local_2698;
      local_17e0 = local_1800;
      local_17a8 = local_1a28;
      uStack_17a0 = uStack_1a20;
      local_1780 = local_2698;
      local_1778 = local_17f0;
      local_16f0 = local_1710;
      local_16b8 = local_1a48;
      uStack_16b0 = uStack_1a40;
      local_1690 = local_1708;
      local_1688 = local_1700;
      local_e98 = local_2698;
      local_e90 = local_2070;
      local_e88 = local_2080;
      local_e80 = local_ea0;
      local_e70 = local_2080;
      local_e50 = local_2080;
      local_e48 = local_20b8;
      uStack_e40 = uStack_20b0;
      local_e20 = local_2698;
      local_e18 = local_2070;
      local_e10 = local_e78;
      local_df0 = local_e78;
      local_de8 = local_27a8;
      uStack_de0 = uStack_27a0;
      local_db0 = local_1fe0;
      local_da0 = local_2060;
      local_d98 = local_ea0;
      local_d90 = local_1fe0;
      local_d80 = local_ea0;
      local_d60 = local_ea0;
      local_d58 = local_20d8;
      uStack_d50 = uStack_20d0;
      local_d30 = local_da8;
      local_d28 = local_2060;
      local_d20 = local_d88;
      local_d00 = local_d88;
      local_cf8 = uVar5;
      uStack_cf0 = uVar6;
      local_cb8 = local_2698;
      local_cb0 = local_21c0;
      local_ca8 = local_21d0;
      local_ca0 = local_cc0;
      local_c90 = local_21d0;
      local_c70 = local_21d0;
      local_c68 = local_2208;
      uStack_c60 = uStack_2200;
      local_c40 = local_2698;
      local_c38 = local_21c0;
      local_c30 = local_c98;
      local_c10 = local_c98;
      local_bd0 = local_2130;
      local_bc0 = local_21b0;
      local_bb8 = local_cc0;
      local_bb0 = local_2130;
      local_ba0 = local_cc0;
      local_b80 = local_cc0;
      local_b78 = local_2228;
      uStack_b70 = uStack_2220;
      local_b50 = local_bc8;
      local_b48 = local_21b0;
      local_b40 = local_ba8;
      local_b20 = local_ba8;
      local_ad8 = local_2698;
      local_ad0 = local_2310;
      local_ac8 = local_2320;
      local_ac0 = local_ae0;
      local_ab0 = local_2320;
      local_a90 = local_2320;
      local_a88 = local_2358;
      uStack_a80 = uStack_2350;
      local_a60 = local_2698;
      local_a58 = local_2310;
      local_a50 = local_ab8;
      local_a30 = local_ab8;
      local_9f0 = local_2280;
      local_9e0 = local_2300;
      local_9d8 = local_ae0;
      local_9d0 = local_2280;
      local_9c0 = local_ae0;
      local_9a0 = local_ae0;
      local_998 = local_2378;
      uStack_990 = uStack_2370;
      local_970 = local_9e8;
      local_968 = local_2300;
      local_960 = local_9c8;
      local_940 = local_9c8;
      local_918 = local_18d8;
      local_910 = local_18d0;
      local_8e8 = local_18d8;
      local_8e0 = local_18d0;
      local_8d8 = local_18d0;
      local_2898 = local_26c8;
      uStackY_2890 = uStack_26c0;
      local_2888 = local_26b8;
      uStackY_2880 = uStack_26b0;
      local_2878 = local_26e8;
      pIStackY_2870 = pIStack_26e0;
      local_27a8 = local_28a8;
      uStack_27a0 = uStackY_28a0;
      local_26f8 = local_24d8;
      uStack_26f0 = uStack_24d0;
      local_26e8 = CONCAT44(fStack_2544,local_2548);
      pIStack_26e0 = (ISPCInstance *)CONCAT44(fStack_253c,fStack_2540);
      local_26d8 = local_28a8;
      uStack_26d0 = uStackY_28a0;
      local_26c8 = local_23c8;
      uStack_26c0 = uStack_23c0;
      local_26b8 = local_23d8;
      uStack_26b0 = uStack_23d0;
      local_23d8 = CONCAT44(fStack_aa4,local_aa8);
      uStack_23d0 = CONCAT44(fStack_a9c,fStack_aa0);
      local_23c8 = CONCAT44(fStack_c84,local_c88);
      uStack_23c0 = CONCAT44(fStack_c7c,fStack_c80);
      local_23b8 = local_28a8;
      uStack_23b0 = uStackY_28a0;
      local_2378 = CONCAT44(fStack_2274,local_2278);
      uStack_2370 = CONCAT44(fStack_226c,fStack_2270);
      local_2358 = CONCAT44(fStack_9b4,local_9b8);
      uStack_2350 = CONCAT44(fStack_9ac,fStack_9b0);
      local_2228 = CONCAT44(fStack_2124,local_2128);
      uStack_2220 = CONCAT44(fStack_211c,fStack_2120);
      local_2208 = CONCAT44(fStack_b94,local_b98);
      uStack_2200 = CONCAT44(fStack_b8c,fStack_b90);
      local_20d8 = CONCAT44(fStack_1fd4,local_1fd8);
      uStack_20d0 = CONCAT44(fStack_1fcc,fStack_1fd0);
      local_20b8 = CONCAT44(fStack_d74,local_d78);
      uStack_20b0 = CONCAT44(fStack_d6c,fStack_d70);
      local_1a48 = CONCAT44(fStack_1944,local_1948);
      uStack_1a40 = CONCAT44(fStack_193c,fStack_1940);
      local_1a28 = CONCAT44(fStack_16d4,local_16d8);
      uStack_1a20 = CONCAT44(fStack_16cc,fStack_16d0);
      local_1818 = local_1798;
      uStack_1810 = uStack_1790;
      local_1728 = local_16a8;
      uStack_1720 = uStack_16a0;
      local_eb8 = local_e38;
      uStack_eb0 = uStack_e30;
      local_dc8 = local_d48;
      uStack_dc0 = uStack_d40;
      local_cd8 = local_c58;
      uStack_cd0 = uStack_c50;
      local_be8 = local_b68;
      uStack_be0 = uStack_b60;
      local_af8 = local_a78;
      uStack_af0 = uStack_a70;
      local_a08 = local_988;
      uStack_a00 = uStack_980;
    }
    local_27c4 = local_27c4 + 1;
  }
  uVar2 = *(uint *)(*(long *)(local_27c0 + (ulong)*(uint *)(local_2758 + 0x48) * 8) + 0x10);
  fVar1 = *(float *)(local_2760 + 0x30);
  local_648 = (float)local_27a8;
  fStack_644 = (float)((ulong)local_27a8 >> 0x20);
  fStack_640 = (float)uStack_27a0;
  fStack_63c = (float)((ulong)uStack_27a0 >> 0x20);
  local_6a8 = (float)local_838;
  fStack_6a4 = (float)((ulong)local_838 >> 0x20);
  fStack_6a0 = (float)uStack_830;
  fStack_69c = (float)((ulong)uStack_830 >> 0x20);
  *(ulong *)(local_2760 + 0x30) =
       CONCAT44(fVar1 * fStack_644 + fStack_6a4,fVar1 * local_648 + local_6a8);
  *(ulong *)(local_2760 + 0x38) =
       CONCAT44(fVar1 * fStack_63c + fStack_69c,fVar1 * fStack_640 + fStack_6a0);
  fVar1 = *(float *)(local_2760 + 0x40);
  local_378 = (float)local_508;
  fStack_374 = (float)((ulong)local_508 >> 0x20);
  fStack_370 = (float)uStack_500;
  fStack_36c = (float)((ulong)uStack_500 >> 0x20);
  *(ulong *)(local_2760 + 0x40) =
       CONCAT44(fVar1 * fStack_644 + fStack_374,fVar1 * local_648 + local_378);
  *(ulong *)(local_2760 + 0x48) =
       CONCAT44(fVar1 * fStack_63c + fStack_36c,fVar1 * fStack_640 + fStack_370);
  return uVar2;
}

Assistant:

unsigned int postIntersect(const TutorialData& data, const Ray& ray, DifferentialGeometry& dg)
{
  AffineSpace3fa local2world = AffineSpace3fa::scale(Vec3fa(1));
  ISPCGeometry** geometries = data.ispc_scene->geometries;
  
  for (int i=0; i<RTC_MAX_INSTANCE_LEVEL_COUNT; i++)
  {
    const unsigned int instID = ray.instID[i];
    if (instID == -1) break;

    if (geometries[instID]->type == INSTANCE) {
      ISPCInstance* instance = (ISPCInstancePtr) geometries[instID];
      local2world = local2world * calculate_interpolated_space(instance,ray.time());

      assert(instance->child->type == GROUP);
      geometries = ((ISPCGroup*)instance->child)->geometries;
    }
#if defined(RTC_GEOMETRY_INSTANCE_ARRAY)
    else if (geometries[instID]->type == INSTANCE_ARRAY) {
      ISPCInstanceArray* instanceArray = (ISPCInstanceArrayPtr) geometries[instID];
      local2world = local2world * calculate_interpolated_space(instanceArray,ray.instPrimID[i],ray.time());
      assert(instanceArray->child->type == GROUP);
      geometries = ((ISPCGroup*)instanceArray->child)->geometries;
    }
#endif
  }

  ISPCGeometry* mesh = geometries[ray.geomID];
  unsigned int materialID = mesh->materialID;
  
  dg.Ng = xfmVector(local2world,dg.Ng);
  dg.Ns = xfmVector(local2world,dg.Ns);
  
  return materialID;
}